

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readwritefile.cpp
# Opt level: O2

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
ReadBinaryFile_abi_cxx11_
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,path *filename,size_t maxsize)

{
  long lVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  long in_FS_OFFSET;
  pair<bool,_const_char_*> local_e8;
  char buffer [128];
  string retval;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = fsbridge::fopen((char *)filename,"rb");
  if (__stream == (FILE *)0x0) {
    buffer[0] = '\0';
    buffer._8_8_ = (long)" \t" + 2;
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pair<bool,_const_char_*,_true>(__return_storage_ptr__,(pair<bool,_const_char_*> *)buffer);
  }
  else {
    retval._M_dataplus._M_p = (pointer)&retval.field_2;
    retval._M_string_length = 0;
    retval.field_2._M_local_buf[0] = '\0';
    do {
      sVar3 = maxsize - retval._M_string_length;
      if (0x7f < sVar3) {
        sVar3 = 0x80;
      }
      sVar3 = fread(buffer,1,sVar3,__stream);
      iVar2 = ferror(__stream);
      if (iVar2 != 0) {
        fclose(__stream);
        local_e8.first = false;
        local_e8.second = "";
        std::
        pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<bool,_const_char_*,_true>(__return_storage_ptr__,&local_e8);
        goto LAB_0060b372;
      }
      std::__cxx11::string::append<char*,void>((string *)&retval,buffer,buffer + sVar3);
      iVar2 = feof(__stream);
    } while ((iVar2 == 0) && (retval._M_string_length < maxsize));
    fclose(__stream);
    __return_storage_ptr__->first = true;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->second,&retval);
LAB_0060b372:
    std::__cxx11::string::~string((string *)&retval);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<bool,std::string> ReadBinaryFile(const fs::path &filename, size_t maxsize)
{
    FILE *f = fsbridge::fopen(filename, "rb");
    if (f == nullptr)
        return std::make_pair(false,"");
    std::string retval;
    char buffer[128];
    do {
        const size_t n = fread(buffer, 1, std::min(sizeof(buffer), maxsize - retval.size()), f);
        // Check for reading errors so we don't return any data if we couldn't
        // read the entire file (or up to maxsize)
        if (ferror(f)) {
            fclose(f);
            return std::make_pair(false,"");
        }
        retval.append(buffer, buffer+n);
    } while (!feof(f) && retval.size() < maxsize);
    fclose(f);
    return std::make_pair(true,retval);
}